

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

int nghttp2_frame_unpack_origin_payload
              (nghttp2_extension *frame,uint8_t *payload,size_t payloadlen,nghttp2_mem *mem)

{
  size_t *psVar1;
  uint16_t uVar2;
  ulong uVar3;
  uint8_t *puVar4;
  long local_70;
  size_t len;
  size_t nov;
  nghttp2_origin_entry *ov;
  size_t originlen;
  uint8_t *dst;
  uint8_t *end;
  uint8_t *p;
  nghttp2_ext_origin *origin;
  nghttp2_mem *mem_local;
  size_t payloadlen_local;
  uint8_t *payload_local;
  nghttp2_extension *frame_local;
  
  len = 0;
  local_70 = 0;
  psVar1 = (size_t *)frame->payload;
  end = payload;
  dst = payload;
  if (payloadlen != 0) {
    dst = payload + payloadlen;
  }
  while( true ) {
    if (end == dst) {
      if (len == 0) {
        psVar1[1] = 0;
        *psVar1 = 0;
        frame_local._4_4_ = 0;
      }
      else {
        nov = (size_t)nghttp2_mem_malloc(mem,len * 0x10 + local_70);
        if ((void *)nov == (void *)0x0) {
          frame_local._4_4_ = -0x385;
        }
        else {
          psVar1[1] = nov;
          *psVar1 = len;
          originlen = nov + len * 0x10;
          end = payload;
          while (end != dst) {
            uVar2 = nghttp2_get_uint16(end);
            uVar3 = (ulong)uVar2;
            end = end + 2;
            if (uVar3 != 0) {
              *(size_t *)nov = originlen;
              *(ulong *)(nov + 8) = uVar3;
              puVar4 = nghttp2_cpymem((uint8_t *)originlen,end,uVar3);
              originlen = (size_t)(puVar4 + 1);
              *puVar4 = '\0';
              end = end + uVar3;
              nov = nov + 0x10;
            }
          }
          frame_local._4_4_ = 0;
        }
      }
      return frame_local._4_4_;
    }
    if ((long)dst - (long)end < 2) break;
    uVar2 = nghttp2_get_uint16(end);
    uVar3 = (ulong)uVar2;
    end = end + 2;
    if (uVar3 != 0) {
      if ((ulong)((long)dst - (long)end) < uVar3) {
        return -0x20a;
      }
      end = end + uVar3;
      local_70 = uVar3 + 1 + local_70;
      len = len + 1;
    }
  }
  return -0x20a;
}

Assistant:

int nghttp2_frame_unpack_origin_payload(nghttp2_extension *frame,
                                        const uint8_t *payload,
                                        size_t payloadlen, nghttp2_mem *mem) {
  nghttp2_ext_origin *origin;
  const uint8_t *p, *end;
  uint8_t *dst;
  size_t originlen;
  nghttp2_origin_entry *ov;
  size_t nov = 0;
  size_t len = 0;

  origin = frame->payload;
  p = end = payload;
  if (payloadlen) {
    end += payloadlen;
  }

  for (; p != end;) {
    if (end - p < 2) {
      return NGHTTP2_ERR_FRAME_SIZE_ERROR;
    }
    originlen = nghttp2_get_uint16(p);
    p += 2;
    if (originlen == 0) {
      continue;
    }
    if (originlen > (size_t)(end - p)) {
      return NGHTTP2_ERR_FRAME_SIZE_ERROR;
    }
    p += originlen;
    /* 1 for terminal NULL */
    len += originlen + 1;
    ++nov;
  }

  if (nov == 0) {
    origin->ov = NULL;
    origin->nov = 0;

    return 0;
  }

  len += nov * sizeof(nghttp2_origin_entry);

  ov = nghttp2_mem_malloc(mem, len);
  if (ov == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  origin->ov = ov;
  origin->nov = nov;

  dst = (uint8_t *)ov + nov * sizeof(nghttp2_origin_entry);
  p = payload;

  for (; p != end;) {
    originlen = nghttp2_get_uint16(p);
    p += 2;
    if (originlen == 0) {
      continue;
    }
    ov->origin = dst;
    ov->origin_len = originlen;
    dst = nghttp2_cpymem(dst, p, originlen);
    *dst++ = '\0';
    p += originlen;
    ++ov;
  }

  return 0;
}